

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafika2.cpp
# Opt level: O1

void line(int x0,int y0,int x1,int y1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  
  uVar2 = x1 - x0;
  uVar9 = -uVar2;
  if (0 < (int)uVar2) {
    uVar9 = uVar2;
  }
  uVar6 = (uint)(uVar2 != 0) | (int)uVar2 >> 0x1f;
  uVar3 = y1 - y0;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  uVar3 = (uint)(uVar3 != 0) | (int)uVar3 >> 0x1f;
  lVar5 = (long)(y0 + -100) * -0x66666667;
  FrameBuffer::set(0x1040b8,x0,y0,'\0','d',(char)((x0 - (x0 + -100 >> 0x1f)) - 100U >> 1) + '\x0f',
                   ((char)(uint)((ulong)lVar5 >> 0x21) - (char)(lVar5 >> 0x3f)) + -0x38);
  if (uVar9 < uVar2) {
    iVar8 = y0 + uVar3;
    if (iVar8 != y1) {
      iVar1 = uVar9 * 2;
      iVar7 = iVar1 - uVar2;
      uVar9 = 0;
      if (0 < iVar7) {
        uVar9 = uVar6;
      }
      iVar4 = 0;
      if (0 < iVar7) {
        iVar4 = uVar2 * 2;
      }
      iVar10 = uVar9 + x0;
      iVar7 = iVar7 - iVar4;
      do {
        lVar5 = (long)(iVar8 + -100) * -0x66666667;
        FrameBuffer::set(0x1040b8,iVar10,iVar8,'\0','d',
                         (char)((iVar10 - (iVar10 + -100 >> 0x1f)) - 100U >> 1) + '\x0f',
                         ((char)(uint)((ulong)lVar5 >> 0x21) - (char)(lVar5 >> 0x3f)) + -0x38);
        bVar11 = SCARRY4(iVar7,iVar1);
        iVar7 = iVar7 + iVar1;
        if (iVar7 != 0 && bVar11 == iVar7 < 0) {
          do {
            iVar10 = iVar10 + uVar6;
            iVar7 = iVar7 + uVar2 * -2;
          } while (0 < iVar7);
        }
        iVar8 = iVar8 + uVar3;
      } while (iVar8 != y1);
    }
  }
  else {
    iVar8 = x0 + uVar6;
    if (iVar8 != x1) {
      iVar1 = uVar2 * 2;
      iVar7 = iVar1 - uVar9;
      uVar2 = 0;
      if (0 < iVar7) {
        uVar2 = uVar3;
      }
      iVar4 = 0;
      if (0 < iVar7) {
        iVar4 = uVar9 * 2;
      }
      iVar10 = uVar2 + y0;
      iVar7 = iVar7 - iVar4;
      do {
        lVar5 = (long)(iVar10 + -100) * -0x66666667;
        FrameBuffer::set(0x1040b8,iVar8,iVar10,'\0','d',
                         (char)((iVar8 - (iVar8 + -100 >> 0x1f)) - 100U >> 1) + '\x0f',
                         ((char)(uint)((ulong)lVar5 >> 0x21) - (char)(lVar5 >> 0x3f)) + -0x38);
        bVar11 = SCARRY4(iVar7,iVar1);
        iVar7 = iVar7 + iVar1;
        if (iVar7 != 0 && bVar11 == iVar7 < 0) {
          do {
            iVar10 = iVar10 + uVar3;
            iVar7 = iVar7 + uVar9 * -2;
          } while (0 < iVar7);
        }
        iVar8 = iVar8 + uVar6;
      } while (iVar8 != x1);
    }
  }
  return;
}

Assistant:

void line(int x0, int y0, int x1, int y1)
{
  int deltax = x1 - x0;
  int adx = abs(deltax);
  int dx = sign(deltax);

  int deltay = y1 - y0;
  int ady = abs(deltay);
  int dy = sign(deltay);

  setWarna(x0, y0);
  if (adx < ady) {
    int D = 2 * adx - ady;
    int x = x0;
    if (D > 0) {
      x += dx;
      D -= 2 * ady;
    }

    for (int y = y0 + dy; y != y1; y += dy) {
      setWarna(x, y);
      D += 2 * adx;
      while (D > 0) {
        x += dx;
        D -= 2 * ady;
      }
    }
  }
  else {
    int D = 2 * ady - adx;    
    int y = y0;
    if (D > 0) {
      y += dy;
      D -= 2 * adx;
    }

    for (int x = x0 + dx; x != x1; x += dx) {
      setWarna(x, y);
      D += 2 * ady;
      while (D > 0) {
        y += dy;
        D -= 2 * adx;
      }
    }
  }
}